

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void memXor2(void *dest,void *src,size_t count)

{
  ulong uVar1;
  
  for (; 7 < count; count = count - 8) {
    *(ulong *)dest = *dest ^ *src;
    src = (void *)((long)src + 8);
    dest = (void *)((long)dest + 8);
  }
  for (uVar1 = 0; count != uVar1; uVar1 = uVar1 + 1) {
    *(byte *)((long)dest + uVar1) = *(byte *)((long)dest + uVar1) ^ *(byte *)((long)src + uVar1);
  }
  return;
}

Assistant:

void memXor2(void* dest, const void* src, size_t count)
{
	ASSERT(memIsSameOrDisjoint(src, dest, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		*(word*)dest ^= *(const word*)src;
		src = (const word*)src + 1;
		dest = (word*)dest + 1;
	}
	while (count--)
	{
		*(octet*)dest ^= *(const octet*)src;
		src = (const octet*)src + 1;
		dest = (octet*)dest + 1;
	}
}